

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeStiffnessMatrix(ChElementTetraCorot_4 *this)

{
  ChMatrixNM<double,_4,_4> *dst;
  long lVar1;
  long lVar2;
  element_type *peVar3;
  long lVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ulong uVar8;
  ChLog *this_00;
  ChStreamOutAscii *pCVar9;
  long lVar10;
  char *__function;
  ulong uVar11;
  double *pdVar12;
  int unVal;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  undefined8 *puVar18;
  int unVal_00;
  ActualDstType actualDst;
  long lVar19;
  ulong uVar20;
  ushort uVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [64];
  ActualDstType actualDst_1;
  ChMatrixNM<double,_4,_4> tmp;
  assign_op<double,_double> local_161;
  ulong local_160;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_158;
  long local_118 [3];
  undefined1 local_100 [208];
  
  uVar7 = (**(code **)(*(long *)&((((this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  uVar8 = CONCAT71((int7)((ulong)uVar7 >> 8),7);
  uVar22 = uVar8 & 0xffffffff;
  bVar5 = (byte)uVar22;
  auVar23._8_8_ = (ulong)((byte)(uVar22 >> 1) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value;
  auVar23._0_8_ = (ulong)(bVar5 & 1) * local_158.m_lhs.m_lhs._0_8_;
  auVar23._16_8_ = (ulong)((byte)(uVar22 >> 2) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value;
  auVar23._24_8_ = 0;
  uVar21 = (ushort)uVar22;
  vscatterqpd_avx512vl(ZEXT832((XprTypeNested)local_100) + _DAT_009840e0,uVar22,auVar23);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  auVar24._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value;
  auVar24._0_8_ = (ulong)(bVar5 & 1) * local_158.m_lhs.m_lhs._0_8_;
  auVar24._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value;
  auVar24._24_8_ = 0;
  vscatterqpd_avx512vl
            (ZEXT832((XprTypeNested)local_100) + ZEXT832(8) + _DAT_009840e0,uVar8 & 0xffff,auVar24);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  auVar25._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value;
  auVar25._0_8_ = (ulong)(bVar5 & 1) * local_158.m_lhs.m_lhs._0_8_;
  auVar25._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value;
  auVar25._24_8_ = 0;
  vscatterqpd_avx512vl
            (ZEXT832((XprTypeNested)local_100) + ZEXT832(0x10) + _DAT_009840e0,uVar8 & 0xffff,
             auVar25);
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_158);
  auVar26._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value;
  auVar26._0_8_ = (ulong)(bVar5 & 1) * local_158.m_lhs.m_lhs._0_8_;
  auVar26._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value;
  auVar26._24_8_ = 0;
  vscatterqpd_avx512vl
            (ZEXT832((XprTypeNested)local_100) + ZEXT832(0x18) + _DAT_009840e0,uVar8 & 0xffff,
             auVar26);
  local_100._104_8_ = 0x3ff0000000000000;
  local_100._96_8_ = 0x3ff0000000000000;
  local_100._112_8_ = 0x3ff0000000000000;
  local_100._120_8_ = 0x3ff0000000000000;
  dst = &this->mM;
  local_158.m_lhs.m_lhs._0_8_ = (XprTypeNested)local_100;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,(SrcXprType *)&local_158,(assign_op<double,_double> *)local_118);
  uVar8 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_cols;
  uVar22 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows;
  uVar11 = uVar8 * uVar22;
  if (0 < (long)uVar11) {
    pdVar12 = (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_data;
    *pdVar12 = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[0];
    if (((((((((3 < uVar11) &&
              (pdVar12[3] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[4], 6 < uVar11)) &&
             (pdVar12[6] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[8], 9 < uVar11)) &&
            ((pdVar12[9] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xc], 0xd < uVar11 &&
             (pdVar12[0xd] = (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                             .m_storage.m_data.array[1], 0x10 < uVar11)))) &&
           ((pdVar12[0x10] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[5], 0x13 < uVar11 &&
            ((pdVar12[0x13] =
                   (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                   .m_data.array[9], 0x16 < uVar11 &&
             (pdVar12[0x16] =
                   (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                   .m_data.array[0xd], 0x1a < uVar11)))))) &&
          (pdVar12[0x1a] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2], 0x1d < uVar11)) &&
         ((((pdVar12[0x1d] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[6], 0x20 < uVar11 &&
            (pdVar12[0x20] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[10], 0x23 < uVar11)) &&
           (pdVar12[0x23] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xe], uVar11 != 0x24)) &&
          (((pdVar12[0x24] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[1], 0x25 < uVar11 &&
            (pdVar12[0x25] =
                  (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).m_storage.
                  m_data.array[0], 0x27 < uVar11)) &&
           ((pdVar12[0x27] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[5], uVar11 != 0x28 &&
            ((pdVar12[0x28] =
                   (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                   .m_data.array[4], 0x2a < uVar11 &&
             (pdVar12[0x2a] =
                   (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                   .m_data.array[9], uVar11 != 0x2b)))))))))) &&
        ((pdVar12[0x2b] =
               (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[8], 0x2d < uVar11 &&
         (((pdVar12[0x2d] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xd], uVar11 != 0x2e &&
           (pdVar12[0x2e] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xc], 0x31 < uVar11)) &&
          (pdVar12[0x31] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2], uVar11 != 0x32)))))) &&
       ((((pdVar12[0x32] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[1], 0x34 < uVar11 &&
          (pdVar12[0x34] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[6], uVar11 != 0x35)) &&
         (((pdVar12[0x35] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[5], 0x37 < uVar11 &&
           ((pdVar12[0x37] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[10], uVar11 != 0x38 &&
            (pdVar12[0x38] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[9], 0x3a < uVar11)))) &&
          (pdVar12[0x3a] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[0xe], uVar11 != 0x3b)))) &&
        (((((pdVar12[0x3b] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0xd], 0x3c < uVar11 &&
            (pdVar12[0x3c] =
                  (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2], 0x3e < uVar11)) &&
           (pdVar12[0x3e] =
                 (dst->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>).m_storage.
                 m_data.array[0], uVar11 != 0x3f)) &&
          ((pdVar12[0x3f] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[6], 0x41 < uVar11 &&
           (pdVar12[0x41] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[4], uVar11 != 0x42)))) &&
         ((pdVar12[0x42] =
                (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[10], 0x44 < uVar11 &&
          ((pdVar12[0x44] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[8], uVar11 != 0x45 &&
           (pdVar12[0x45] =
                 (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xe], 0x47 < uVar11)))))))))) {
      pdVar12[0x47] =
           (this->mM).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
           array[0xc];
      if ((long)(uVar8 | uVar22) < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                     );
      }
      peVar3 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (uVar22 == (peVar3->StressStrainMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_rows) {
        local_158.m_lhs.m_lhs.m_lhs.m_functor.m_other = this->Volume;
        local_158.m_lhs.m_lhs.m_rhs.m_matrix = &this->MatrB;
        local_158.m_lhs.m_rhs = &peVar3->StressStrainMatrix;
        local_158.m_lhs.m_lhs.m_lhs.m_rows.m_value = uVar8;
        local_158.m_lhs.m_lhs.m_lhs.m_cols.m_value = uVar22;
        local_158.m_rhs = local_158.m_lhs.m_lhs.m_rhs.m_matrix;
        if ((peVar3->StressStrainMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols ==
            uVar22) {
          Eigen::Matrix<double,-1,-1,1,-1,-1>::
          Matrix<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
                    ((Matrix<double,_1,_1,1,_1,_1> *)local_118,&local_158);
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
                    (&this->StiffnessMatrix,(Matrix<double,__1,__1,_1,__1,__1> *)local_118,
                     &local_161);
          if (local_118[0] != 0) {
            free(*(void **)(local_118[0] + -8));
          }
          local_160 = (this->StiffnessMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_rows;
          lVar10 = 1;
          uVar8 = 1;
          if (1 < (long)local_160) {
            uVar8 = local_160;
          }
          if (uVar8 != 1) {
            lVar4 = (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols;
            lVar14 = 8;
            lVar16 = 0;
            lVar19 = lVar4 * 8;
            lVar1 = lVar4 * 8 + 8;
            uVar22 = local_160;
            do {
              uVar22 = uVar22 - 1;
              lVar16 = lVar16 + 1;
              if (lVar16 < lVar4) {
                pdVar12 = (this->StiffnessMatrix).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                          .m_data;
                uVar11 = 0;
                puVar18 = (undefined8 *)((long)pdVar12 + lVar19);
                do {
                  if (uVar22 == uVar11) goto LAB_0069bc65;
                  uVar7 = *puVar18;
                  lVar2 = lVar10 + 1 + uVar11;
                  puVar18 = puVar18 + lVar4;
                  *(undefined8 *)((long)pdVar12 + uVar11 * 8 + lVar14) = uVar7;
                  uVar11 = uVar11 + 1;
                } while (lVar2 < lVar4);
              }
              lVar10 = lVar10 + 1;
              lVar14 = lVar14 + lVar1;
              lVar19 = lVar19 + lVar1;
            } while (lVar16 != uVar8 - 1);
          }
          if ((long)local_160 < 1) {
            unVal_00 = -1;
            dVar29 = 0.0;
            unVal = -1;
          }
          else {
            auVar27._8_8_ = 0x7fffffffffffffff;
            auVar27._0_8_ = 0x7fffffffffffffff;
            uVar8 = (this->StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                    m_cols;
            pdVar12 = (this->StiffnessMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                      m_data;
            auVar30 = ZEXT1664(ZEXT816(0));
            uVar11 = 0xffffffff;
            uVar22 = 0xffffffff;
            uVar13 = 0;
            pdVar15 = pdVar12;
            do {
              if (0 < (long)uVar8) {
                if (((long)uVar8 <= (long)uVar13) || (local_160 <= uVar8 - 1)) {
LAB_0069bc65:
                  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                               );
                }
                uVar20 = 0;
                pdVar17 = pdVar15;
                do {
                  auVar28._8_8_ = 0;
                  auVar28._0_8_ = pdVar12[uVar20] - *pdVar17;
                  auVar28 = vandpd_avx(auVar28,auVar27);
                  dVar29 = auVar30._0_8_;
                  auVar6 = vmaxsd_avx(auVar28,auVar30._0_16_);
                  auVar30 = ZEXT1664(auVar6);
                  if (dVar29 < auVar28._0_8_) {
                    uVar22 = uVar13 & 0xffffffff;
                    uVar11 = uVar20 & 0xffffffff;
                  }
                  uVar20 = uVar20 + 1;
                  pdVar17 = pdVar17 + uVar8;
                } while (uVar8 != uVar20);
              }
              unVal_00 = (int)uVar22;
              unVal = (int)uVar11;
              dVar29 = auVar30._0_8_;
              uVar13 = uVar13 + 1;
              pdVar15 = pdVar15 + 1;
              pdVar12 = pdVar12 + uVar8;
            } while (uVar13 != local_160);
          }
          if (1e-10 < dVar29) {
            this_00 = GetLog();
            pCVar9 = ChStreamOutAscii::operator<<
                               (&this_00->super_ChStreamOutAscii,
                                "NONSYMMETRIC local stiffness matrix! err ");
            pCVar9 = ChStreamOutAscii::operator<<(pCVar9,dVar29);
            pCVar9 = ChStreamOutAscii::operator<<(pCVar9," at ");
            pCVar9 = ChStreamOutAscii::operator<<(pCVar9,unVal_00);
            pCVar9 = ChStreamOutAscii::operator<<(pCVar9,",");
            pCVar9 = ChStreamOutAscii::operator<<(pCVar9,unVal);
            ChStreamOutAscii::operator<<(pCVar9,"\n");
          }
          return;
        }
        __function = 
        "Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
      }
      else {
        __function = 
        "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Eigen::Matrix<double, -1, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>, const Eigen::Transpose<Eigen::Matrix<double, -1, -1, 1>>>, Rhs = Eigen::Matrix<double, -1, -1, 1>, Option = 0]"
        ;
      }
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_4::ComputeStiffnessMatrix() {
    // M = [ X0_0 X0_1 X0_2 X0_3 ] ^-1
    //     [ 1    1    1    1    ]
    ChMatrixNM<double, 4, 4> tmp;
    tmp.block(0, 0, 3, 1) = nodes[0]->GetX0().eigen();
    tmp.block(0, 1, 3, 1) = nodes[1]->GetX0().eigen();
    tmp.block(0, 2, 3, 1) = nodes[2]->GetX0().eigen();
    tmp.block(0, 3, 3, 1) = nodes[3]->GetX0().eigen();
    tmp.row(3).setConstant(1.0);
    mM = tmp.inverse();

    ////MatrB.Reset(6, 12);
    MatrB(0) = mM(0);
    MatrB(3) = mM(4);
    MatrB(6) = mM(8);
    MatrB(9) = mM(12);
    MatrB(13) = mM(1);
    MatrB(16) = mM(5);
    MatrB(19) = mM(9);
    MatrB(22) = mM(13);
    MatrB(26) = mM(2);
    MatrB(29) = mM(6);
    MatrB(32) = mM(10);
    MatrB(35) = mM(14);
    MatrB(36) = mM(1);
    MatrB(37) = mM(0);
    MatrB(39) = mM(5);
    MatrB(40) = mM(4);
    MatrB(42) = mM(9);
    MatrB(43) = mM(8);
    MatrB(45) = mM(13);
    MatrB(46) = mM(12);
    MatrB(49) = mM(2);
    MatrB(50) = mM(1);
    MatrB(52) = mM(6);
    MatrB(53) = mM(5);
    MatrB(55) = mM(10);
    MatrB(56) = mM(9);
    MatrB(58) = mM(14);
    MatrB(59) = mM(13);
    MatrB(60) = mM(2);
    MatrB(62) = mM(0);
    MatrB(63) = mM(6);
    MatrB(65) = mM(4);
    MatrB(66) = mM(10);
    MatrB(68) = mM(8);
    MatrB(69) = mM(14);
    MatrB(71) = mM(12);

    StiffnessMatrix = Volume * MatrB.transpose() * Material->Get_StressStrainMatrix() * MatrB;

    // ***TEST*** SYMMETRIZE TO AVOID ROUNDOFF ASYMMETRY
    for (int row = 0; row < StiffnessMatrix.rows() - 1; ++row)
        for (int col = row + 1; col < StiffnessMatrix.cols(); ++col)
            StiffnessMatrix(row, col) = StiffnessMatrix(col, row);

    double max_err = 0;
    int err_r = -1;
    int err_c = -1;
    for (int row = 0; row < StiffnessMatrix.rows(); ++row)
        for (int col = 0; col < StiffnessMatrix.cols(); ++col) {
            double diff = fabs(StiffnessMatrix(row, col) - StiffnessMatrix(col, row));
            if (diff > max_err) {
                max_err = diff;
                err_r = row;
                err_c = col;
            }
        }
    if (max_err > 1e-10)
        GetLog() << "NONSYMMETRIC local stiffness matrix! err " << max_err << " at " << err_r << "," << err_c << "\n";
}